

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

int * Wln_RetHeadToTail(Wln_Ret_t *p,int *pHead)

{
  uint uVar1;
  uint *puVar2;
  
  while( true ) {
    uVar1 = *pHead;
    if ((ulong)uVar1 == 0) {
      __assert_fail("pHead[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                    ,0x15e,"int *Wln_RetHeadToTail(Wln_Ret_t *, int *)");
    }
    if (((int)uVar1 < 0) || ((p->vEdgeLinks).nSize <= (int)uVar1)) break;
    puVar2 = (uint *)pHead;
    pHead = (p->vEdgeLinks).pArray + uVar1;
    if (*pHead == 0) {
      return (int *)puVar2;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

int * Wln_RetHeadToTail( Wln_Ret_t * p, int * pHead )
{
    int * pLink;
    assert( pHead[0] );
    pLink = Vec_IntEntryP( &p->vEdgeLinks, pHead[0] );
    if ( pLink[0] == 0 )
        return pHead;
    return Wln_RetHeadToTail( p, pLink );
}